

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecurityDirWrapper.cpp
# Opt level: O1

void * __thiscall
SecurityDirWrapper::getFieldPtr(SecurityDirWrapper *this,size_t fId,size_t subField)

{
  Executable *pEVar1;
  int iVar2;
  offset_t oVar3;
  undefined4 extraout_var;
  void *pvVar4;
  undefined4 extraout_var_00;
  void *pvVar5;
  
  oVar3 = DataDirEntryWrapper::getDirEntryAddress(&this->super_DataDirEntryWrapper);
  pEVar1 = (this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
           super_ExeElementWrapper.m_Exe;
  iVar2 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe])(pEVar1,oVar3,1,0xc,0);
  pvVar4 = (void *)CONCAT44(extraout_var,iVar2);
  pvVar5 = (void *)0x0;
  if (pvVar4 != (void *)0x0) {
    switch(fId) {
    case 0:
      break;
    case 1:
      pvVar4 = (void *)((long)pvVar4 + 4);
      break;
    case 2:
      pvVar4 = (void *)((long)pvVar4 + 6);
      break;
    case 3:
      pvVar4 = (void *)((long)pvVar4 + 8);
      break;
    default:
      iVar2 = (*(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
                super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0xc])
                        (this);
      return (void *)CONCAT44(extraout_var_00,iVar2);
    }
    pvVar5 = pvVar4;
  }
  return pvVar5;
}

Assistant:

void* SecurityDirWrapper::getFieldPtr(size_t fId, size_t subField)
{
    pe::WIN_CERTIFICATE* cert = getCert();
    if (cert == NULL) return 0;

    switch (fId) {
        case CERT_LEN : return &cert->dwLength;
        case REVISION : return &cert->wRevision;
        case TYPE : return &cert->wCertificateType;
        case CERT_CONTENT : return &cert->bCertificate;
    }
    return this->getPtr();
}